

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::NewSlot(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  byte bVar1;
  bool bVar2;
  SQString *x;
  SQChar *pSVar3;
  SQChar *pSVar4;
  int *in_RDX;
  int *in_RSI;
  SQVM *in_RDI;
  byte in_R8B;
  SQObjectPtr oval;
  SQObjectPtr closure_1;
  SQObjectPtr res_1;
  SQObjectPtr *in_stack_00000060;
  SQObjectPtr closure;
  SQClass *in_stack_00000078;
  SQObjectPtr res;
  bool rawcall;
  SQObjectPtr *in_stack_ffffffffffffff38;
  SQVM *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff4c;
  SQMetaMethod SVar5;
  SQObjectPtr *in_stack_ffffffffffffff50;
  SQObjectPtr *this_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar6;
  int iVar7;
  SQVM *in_stack_ffffffffffffff68;
  SQObjectValue in_stack_ffffffffffffff70;
  SQTable *in_stack_ffffffffffffff78;
  SQObjectPtr local_78;
  int local_64;
  SQObjectPtr local_60 [2];
  SQObjectPtr local_40;
  byte local_2a;
  byte local_29;
  int *local_18;
  byte local_1;
  
  local_29 = in_R8B & 1;
  if (*in_RDX == 0x1000001) {
    Raise_Error(in_RDI,"null cannot be used as index");
    local_1 = 0;
    goto LAB_00149c41;
  }
  iVar7 = *in_RSI;
  local_18 = in_RSI;
  if (iVar7 == 0x8004000) {
    bVar2 = SQClass::NewSlot(in_stack_00000078,(SQSharedState *)closure.super_SQObject._unVal.pTable
                             ,(SQObjectPtr *)closure.super_SQObject._0_8_,in_stack_00000060,
                             (bool)res_1.super_SQObject._unVal.nInteger._7_1_);
    if (!bVar2) {
      if ((*(byte *)(*(long *)(local_18 + 2) + 0x1b0) & 1) == 0) {
        x = PrintObjVal(in_stack_ffffffffffffff68,(SQObjectPtr *)in_RDI);
        ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff68,x);
        Raise_Error(in_RDI,"the property \'%s\' already exists",
                    &(in_stack_ffffffffffffff70.pTable)->_firstfree);
        local_1 = 0;
        local_64 = 1;
        ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
      }
      else {
        Raise_Error(in_RDI,"trying to modify a class that has already been instantiated");
        local_1 = 0;
      }
      goto LAB_00149c41;
    }
  }
  else if (iVar7 == 0xa000020) {
    local_2a = 1;
    if (*(long *)(*(long *)(in_RSI + 2) + 0x30) != 0) {
      this_00 = &local_40;
      ::SQObjectPtr::SQObjectPtr(this_00);
      bVar2 = SQTable::Get((SQTable *)in_stack_ffffffffffffff68,(SQObjectPtr *)in_RDI,
                           (SQObjectPtr *)CONCAT44(iVar7,in_stack_ffffffffffffff58));
      uVar6 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff58);
      if (bVar2) {
LAB_00149928:
        local_64 = 0;
      }
      else {
        ::SQObjectPtr::SQObjectPtr(local_60);
        if (*(long *)(*(long *)(local_18 + 2) + 0x30) == 0) {
LAB_00149902:
          local_2a = 1;
LAB_0014990a:
          local_64 = 0;
        }
        else {
          bVar1 = (**(code **)(**(long **)(local_18 + 2) + 0x30))
                            (*(long **)(local_18 + 2),in_RDI,0xd,local_60);
          SVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
          if ((bVar1 & 1) == 0) goto LAB_00149902;
          Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          bVar2 = CallMetaMethod((SQVM *)CONCAT44(iVar7,uVar6),this_00,SVar5,
                                 (SQInteger)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          if (bVar2) {
            local_2a = 0;
            goto LAB_0014990a;
          }
          local_1 = 0;
          local_64 = 1;
        }
        ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
        if (local_64 == 0) goto LAB_00149928;
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
      if (local_64 != 0) goto LAB_00149c41;
    }
    if ((local_2a & 1) != 0) {
      SQTable::NewSlot(in_stack_ffffffffffffff78,(SQObjectPtr *)in_stack_ffffffffffffff70.pTable,
                       (SQObjectPtr *)in_stack_ffffffffffffff68);
    }
  }
  else {
    if (iVar7 != 0xa008000) {
      pSVar3 = GetTypeName((SQObjectPtr *)0x149c02);
      pSVar4 = GetTypeName((SQObjectPtr *)0x149c14);
      Raise_Error(in_RDI,"indexing %s with %s",pSVar3,pSVar4);
      local_1 = 0;
      goto LAB_00149c41;
    }
    ::SQObjectPtr::SQObjectPtr(&local_78);
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff78);
    if (*(long *)(*(long *)(local_18 + 2) + 0x30) == 0) {
LAB_00149aaa:
      Raise_Error(in_RDI,"class instances do not support the new slot operator");
      local_1 = 0;
      local_64 = 1;
    }
    else {
      bVar1 = (**(code **)(**(long **)(local_18 + 2) + 0x30))
                        (*(long **)(local_18 + 2),in_RDI,0xd,&stack0xffffffffffffff78);
      SVar5 = CONCAT22((short)((uint)in_stack_ffffffffffffff4c >> 0x10),
                       CONCAT11(bVar1,(char)in_stack_ffffffffffffff4c));
      if ((bVar1 & 1) == 0) goto LAB_00149aaa;
      Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      bVar2 = CallMetaMethod((SQVM *)CONCAT44(iVar7,in_stack_ffffffffffffff58),
                             in_stack_ffffffffffffff50,SVar5,(SQInteger)in_stack_ffffffffffffff40,
                             in_stack_ffffffffffffff38);
      if (bVar2) {
        local_64 = 2;
      }
      else {
        local_1 = 0;
        local_64 = 1;
      }
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
    if (local_64 == 1) goto LAB_00149c41;
  }
  local_1 = 1;
LAB_00149c41:
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::NewSlot(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    if(type(key) == OT_NULL) { Raise_Error(_SC("null cannot be used as index")); return false; }
    switch(type(self)) {
    case OT_TABLE: {
        bool rawcall = true;
        if(_table(self)->_delegate) {
            SQObjectPtr res;
            if(!_table(self)->Get(key,res)) {
                SQObjectPtr closure;
                if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
                    Push(self);Push(key);Push(val);
                    if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                        return false;
                    }
                    rawcall = false;
                }
                else {
                    rawcall = true;
                }
            }
        }
        if(rawcall) _table(self)->NewSlot(key,val); //cannot fail

        break;}
    case OT_INSTANCE: {
        SQObjectPtr res;
        SQObjectPtr closure;
        if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
            Push(self);Push(key);Push(val);
            if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                return false;
            }
            break;
        }
        Raise_Error(_SC("class instances do not support the new slot operator"));
        return false;
        break;}
    case OT_CLASS:
        if(!_class(self)->NewSlot(_ss(this),key,val,bstatic)) {
            if(_class(self)->_locked) {
                Raise_Error(_SC("trying to modify a class that has already been instantiated"));
                return false;
            }
            else {
                SQObjectPtr oval = PrintObjVal(key);
                Raise_Error(_SC("the property '%s' already exists"),_stringval(oval));
                return false;
            }
        }
        break;
    default:
        Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key));
        return false;
        break;
    }
    return true;
}